

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfChannelListAttribute.cpp
# Opt level: O0

void __thiscall
Imf_3_3::TypedAttribute<Imf_3_3::ChannelList>::readValueFrom
          (TypedAttribute<Imf_3_3::ChannelList> *this,IStream *is,int size,int version)

{
  long in_RDI;
  int ySampling;
  int xSampling;
  bool pLinear;
  int type;
  char name [256];
  char *in_stack_00000158;
  ChannelList *in_stack_00000160;
  int in_stack_000002ac;
  IStream *in_stack_000002b0;
  undefined4 in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  IStream *in_stack_fffffffffffffeb0;
  Channel local_138;
  int local_128;
  int local_124;
  byte local_11d;
  PixelType local_11c;
  char local_118;
  
  while( true ) {
    Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,(char *)0x120b99);
    if (local_118 == '\0') break;
    (anonymous_namespace)::checkIsNullTerminated<256ul>
              ((char (*) [256])name._48_8_,(char *)name._40_8_);
    Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>
              (in_stack_fffffffffffffeb0,
               (int *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>
              (in_stack_fffffffffffffeb0,
               (bool *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    Xdr::skip<Imf_3_3::StreamIO,Imf_3_3::IStream>(in_stack_000002b0,in_stack_000002ac);
    Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>
              (in_stack_fffffffffffffeb0,
               (int *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    Xdr::read<Imf_3_3::StreamIO,Imf_3_3::IStream>
              (in_stack_fffffffffffffeb0,
               (int *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
    if (((local_11c != UINT) && (local_11c != HALF)) && (local_11c != FLOAT)) {
      local_11c = NUM_PIXELTYPES;
    }
    in_stack_fffffffffffffeb0 = (IStream *)(in_RDI + 8);
    Channel::Channel(&local_138,local_11c,local_124,local_128,(bool)(local_11d & 1));
    ChannelList::insert(in_stack_00000160,in_stack_00000158,(Channel *)this);
  }
  return;
}

Assistant:

IMF_EXPORT void
ChannelListAttribute::readValueFrom (IStream& is, int size, int version)
{
    while (true)
    {
        //
        // Read name; zero length name means end of channel list
        //

        char name[Name::SIZE];
        Xdr::read<StreamIO> (is, Name::MAX_LENGTH, name);

        if (name[0] == 0) break;

        checkIsNullTerminated (name, "channel name");

        //
        // Read Channel struct
        //

        int  type;
        bool pLinear;
        int  xSampling;
        int  ySampling;

        Xdr::read<StreamIO> (is, type);
        Xdr::read<StreamIO> (is, pLinear);
        Xdr::skip<StreamIO> (is, 3);
        Xdr::read<StreamIO> (is, xSampling);
        Xdr::read<StreamIO> (is, ySampling);

        //
        // prevent invalid values being written to PixelType enum
        // by forcing all unknown types to NUM_PIXELTYPES which is also an invalid
        // pixel type, but can be used as a PixelType enum value
        // (Header::sanityCheck will throw an exception when files with invalid PixelTypes are read)
        //
        if (type != OPENEXR_IMF_INTERNAL_NAMESPACE::UINT &&
            type != OPENEXR_IMF_INTERNAL_NAMESPACE::HALF &&
            type != OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT)
        {
            type = OPENEXR_IMF_INTERNAL_NAMESPACE::NUM_PIXELTYPES;
        }

        _value.insert (
            name, Channel (PixelType (type), xSampling, ySampling, pLinear));
    }
}